

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_SetAddCut(Lf_Cut_t **pCuts,int nCuts,int nCutNum)

{
  Lf_Cut_t *pLVar1;
  int nCuts_00;
  int iVar2;
  Lf_Cut_t *t;
  int nCutNum_local;
  int nCuts_local;
  Lf_Cut_t **pCuts_local;
  
  if (nCuts == 0) {
    pCuts_local._4_4_ = 1;
  }
  else {
    nCuts_00 = Lf_SetLastCutContainsArea(pCuts,nCuts);
    if (nCuts_00 < 1) {
      __assert_fail("nCuts >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                    ,900,"int Lf_SetAddCut(Lf_Cut_t **, int, int)");
    }
    iVar2 = Lf_CutCompareDelay(*pCuts,pCuts[nCuts_00]);
    if (iVar2 == 1) {
      pLVar1 = *pCuts;
      *pCuts = pCuts[nCuts_00];
      pCuts[nCuts_00] = pLVar1;
      if (((*(uint *)&(*pCuts)->field_0x14 >> 0x18 < *(uint *)&pCuts[nCuts_00]->field_0x14 >> 0x18)
          && (((*pCuts)->Sign & pCuts[nCuts_00]->Sign) == (*pCuts)->Sign)) &&
         (iVar2 = Lf_SetCutIsContainedOrder(pCuts[nCuts_00],*pCuts), iVar2 != 0)) {
        return nCuts_00;
      }
    }
    Lf_SetSortByArea(pCuts,nCuts_00);
    pCuts_local._4_4_ = Abc_MinInt(nCuts_00 + 1,nCutNum + -1);
  }
  return pCuts_local._4_4_;
}

Assistant:

static inline int Lf_SetAddCut( Lf_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Lf_SetLastCutContainsArea(pCuts, nCuts);
    assert( nCuts >= 1 );
    if ( Lf_CutCompareDelay(pCuts[0], pCuts[nCuts]) == 1 ) // new cut is better for delay
    {
        ABC_SWAP( Lf_Cut_t *, pCuts[0], pCuts[nCuts] );
        // if old cut (now cut number nCuts) is contained - remove it
        if ( pCuts[0]->nLeaves < pCuts[nCuts]->nLeaves && (pCuts[0]->Sign & pCuts[nCuts]->Sign) == pCuts[0]->Sign && Lf_SetCutIsContainedOrder(pCuts[nCuts], pCuts[0]) )
            return nCuts;
    }
    // sort area cuts by area
    Lf_SetSortByArea( pCuts, nCuts );
    // add new cut if there is room
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}